

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingPointers.cpp
# Opt level: O0

int main(void)

{
  Severity SVar1;
  SessionWriter *pSVar2;
  data_ref pacVar3;
  data_ref pacVar4;
  uint64_t clock;
  cx_string<12UL> cVar5;
  uint64_t _binlog_sid_v_3;
  void *const_void_pointer;
  int *const_any_pointer;
  uint64_t _binlog_sid_v_2;
  void *void_pointer;
  int *any_pointer;
  uintptr_t address;
  uint64_t _binlog_sid_v_1;
  int value;
  uint64_t _binlog_sid_v;
  shared_ptr<int> sptr;
  unique_ptr<int,_std::default_delete<int>_> uptr;
  int *ptr;
  memory_order __b_6;
  memory_order __b_4;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_7;
  memory_order __b_5;
  memory_order __b_3;
  memory_order __b_1;
  unique_ptr<int,_std::default_delete<int>_> *in_stack_fffffffffffff758;
  EventSource *in_stack_fffffffffffff760;
  char (*in_stack_fffffffffffff768) [25];
  __atomic_base<unsigned_long> _Var6;
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffff770;
  uint64_t in_stack_fffffffffffff778;
  atomic<unsigned_long> *in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff78c;
  Session *in_stack_fffffffffffff790;
  int **in_stack_fffffffffffff798;
  allocator *paVar7;
  char (*in_stack_fffffffffffff7a0) [19];
  address *in_stack_fffffffffffff7a8;
  string *this;
  char (*in_stack_fffffffffffff7b0) [25];
  string *this_00;
  address local_558;
  undefined1 local_54d;
  undefined1 local_54c;
  undefined1 local_54b;
  undefined1 local_54a;
  allocator local_549;
  address local_548;
  cx_string<50UL> local_53f;
  allocator local_50c;
  allocator local_50b;
  allocator local_50a;
  allocator local_509;
  undefined8 local_508;
  undefined2 local_500;
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  undefined8 local_498;
  string local_490 [32];
  string local_470 [32];
  __atomic_base<unsigned_long> local_450;
  void *local_448;
  void *local_440;
  address local_438;
  undefined1 local_42d;
  undefined1 local_42c;
  undefined1 local_42b;
  undefined1 local_42a;
  allocator local_429;
  address local_428;
  cx_string<50UL> local_41f;
  allocator local_3ec;
  allocator local_3eb;
  allocator local_3ea;
  allocator local_3e9;
  undefined8 local_3e8;
  undefined2 local_3e0;
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  undefined8 local_378;
  string local_370 [32];
  string local_350 [32];
  __atomic_base<unsigned_long> local_330;
  undefined8 local_328;
  void *local_320;
  void *local_318;
  undefined1 local_30d;
  undefined1 local_30c;
  undefined1 local_30b;
  undefined1 local_30a;
  allocator local_309;
  char local_308 [5];
  char acStack_303 [3];
  undefined4 local_300;
  char local_2fc;
  cx_string<12UL> local_2f8;
  allocator local_2e4;
  allocator local_2e3;
  allocator local_2e2;
  allocator local_2e1;
  undefined8 local_2e0;
  undefined2 local_2d8;
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  undefined8 local_270;
  string local_268 [32];
  string local_248 [32];
  __atomic_base<unsigned_long> local_228;
  undefined4 local_21c;
  undefined1 local_215;
  undefined1 local_214;
  undefined1 local_213;
  undefined1 local_212;
  allocator local_211;
  char local_210 [5];
  char acStack_20b [3];
  undefined4 local_208;
  char local_204;
  cx_string<12UL> local_200;
  allocator local_1ec;
  allocator local_1eb;
  allocator local_1ea;
  allocator local_1e9;
  undefined8 local_1e8;
  undefined2 local_1e0;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  undefined8 local_178;
  string local_170 [32];
  string local_150 [32];
  __atomic_base<unsigned_long> local_130;
  undefined4 local_114;
  unique_ptr<int,_std::default_delete<int>_> local_110 [2];
  undefined4 local_fc;
  undefined4 *local_f0;
  int local_e4;
  __atomic_base<unsigned_long> local_e0;
  memory_order local_d8;
  undefined4 local_d4;
  atomic<unsigned_long> *local_d0;
  __atomic_base<unsigned_long> local_c8;
  memory_order local_c0;
  undefined4 local_bc;
  atomic<unsigned_long> *local_b8;
  __atomic_base<unsigned_long> local_b0;
  memory_order local_a8;
  undefined4 local_a4;
  atomic<unsigned_long> *local_a0;
  __atomic_base<unsigned_long> local_98;
  memory_order local_90;
  undefined4 local_8c;
  atomic<unsigned_long> *local_88;
  Session *local_80;
  memory_order local_78;
  int local_74;
  Session *local_70;
  atomic<unsigned_long> *local_68;
  __int_type local_60;
  memory_order local_58;
  int local_54;
  __atomic_base<unsigned_long> local_50;
  atomic<unsigned_long> *local_48;
  __int_type local_40;
  memory_order local_38;
  int local_34;
  __atomic_base<unsigned_long> local_30;
  atomic<unsigned_long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __atomic_base<unsigned_long> local_10;
  atomic<unsigned_long> *local_8;
  
  local_e4 = 0;
  local_f0 = (undefined4 *)0x0;
  local_fc = 1;
  std::make_unique<int,int>((int *)in_stack_fffffffffffff768);
  local_114 = 2;
  std::make_shared<int,int>((int *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x102525);
  if (SVar1 < 0x81) {
    local_88 = &main::_binlog_sid;
    local_8c = 0;
    local_90 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_98 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_130 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_1e8 = 0;
      local_1e0 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"main",&local_1e9);
      local_215 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,"main",&local_1ea);
      local_214 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingPointers.cpp"
                 ,&local_1eb);
      local_213 = 1;
      local_178 = 0xe;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"Pointers: {} {} {}",&local_1ec);
      local_212 = 1;
      cVar5 = binlog::detail::
              concatenated_tags<char_const(&)[19],int*&,std::unique_ptr<int,std::default_delete<int>>&,std::shared_ptr<int>&>
                        (in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,
                         (unique_ptr<int,_std::default_delete<int>_> *)in_stack_fffffffffffff790,
                         (shared_ptr<int> *)
                         CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
      local_200._data._8_5_ = cVar5._data._8_5_;
      local_208 = cVar5._data._8_4_;
      local_204 = cVar5._data[0xc];
      local_210 = cVar5._data._0_5_;
      acStack_20b = cVar5._data._5_3_;
      local_200._data._0_5_ = local_210;
      local_200._data._5_3_ = acStack_20b;
      pacVar3 = mserialize::cx_string<12UL>::data(&local_200);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,*pacVar3,&local_211);
      local_212 = 0;
      local_213 = 0;
      local_214 = 0;
      local_215 = 0;
      local_130._M_i =
           binlog::Session::addEventSource
                     (in_stack_fffffffffffff790,
                      (EventSource *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
      binlog::EventSource::~EventSource(in_stack_fffffffffffff760);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      std::allocator<char>::~allocator((allocator<char> *)&local_1ec);
      std::allocator<char>::~allocator((allocator<char> *)&local_1eb);
      std::allocator<char>::~allocator((allocator<char> *)&local_1ea);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      local_8 = &main::_binlog_sid;
      local_10._M_i = local_130._M_i;
      local_14 = 5;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10._M_i;
      if ((local_14 != 3) && (local_14 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_10._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    in_stack_fffffffffffff758 = local_110;
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[19],int*&,std::unique_ptr<int,std::default_delete<int>>&,std::shared_ptr<int>&>
              ((SessionWriter *)in_stack_fffffffffffff780,in_stack_fffffffffffff778,
               (uint64_t)in_stack_fffffffffffff770,(char (*) [19])in_stack_fffffffffffff768,
               (int **)in_stack_fffffffffffff760,in_stack_fffffffffffff758,
               (shared_ptr<int> *)in_stack_fffffffffffff790);
  }
  local_21c = 3;
  local_f0 = &local_21c;
  std::unique_ptr<int,_std::default_delete<int>_>::reset
            ((unique_ptr<int,_std::default_delete<int>_> *)in_stack_fffffffffffff760,
             (pointer)in_stack_fffffffffffff758);
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::reset(in_stack_fffffffffffff770);
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x102c52);
  if (SVar1 < 0x81) {
    local_a0 = &main::_binlog_sid;
    local_a4 = 0;
    local_a8 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_b0 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_228 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_2e0 = 0;
      local_2d8 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d0,"main",&local_2e1);
      local_30d = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b0,"main",&local_2e2);
      local_30c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_290,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingPointers.cpp"
                 ,&local_2e3);
      local_30b = 1;
      local_270 = 0x16;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_268,"Pointers: {} {} {}",&local_2e4);
      local_30a = 1;
      cVar5 = binlog::detail::
              concatenated_tags<char_const(&)[19],int*&,std::unique_ptr<int,std::default_delete<int>>&,std::shared_ptr<int>&>
                        (in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,
                         (unique_ptr<int,_std::default_delete<int>_> *)in_stack_fffffffffffff790,
                         (shared_ptr<int> *)
                         CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
      local_2f8._data._8_5_ = cVar5._data._8_5_;
      local_300 = cVar5._data._8_4_;
      local_2fc = cVar5._data[0xc];
      local_308 = cVar5._data._0_5_;
      acStack_303 = cVar5._data._5_3_;
      local_2f8._data._0_5_ = local_308;
      local_2f8._data._5_3_ = acStack_303;
      pacVar3 = mserialize::cx_string<12UL>::data(&local_2f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_248,*pacVar3,&local_309);
      local_30a = 0;
      local_30b = 0;
      local_30c = 0;
      local_30d = 0;
      local_228._M_i =
           binlog::Session::addEventSource
                     (in_stack_fffffffffffff790,
                      (EventSource *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
      binlog::EventSource::~EventSource(in_stack_fffffffffffff760);
      std::allocator<char>::~allocator((allocator<char> *)&local_309);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e4);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e3);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e2);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
      local_28 = &main::_binlog_sid;
      local_30._M_i = local_228._M_i;
      local_34 = 5;
      local_38 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_40 = local_30._M_i;
      if ((local_34 != 3) && (local_34 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_30._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    in_stack_fffffffffffff758 = local_110;
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[19],int*&,std::unique_ptr<int,std::default_delete<int>>&,std::shared_ptr<int>&>
              ((SessionWriter *)in_stack_fffffffffffff780,in_stack_fffffffffffff778,
               (uint64_t)in_stack_fffffffffffff770,(char (*) [19])in_stack_fffffffffffff768,
               (int **)in_stack_fffffffffffff760,in_stack_fffffffffffff758,
               (shared_ptr<int> *)in_stack_fffffffffffff790);
  }
  local_318 = (void *)0xf777123;
  local_320 = (void *)0xf777123;
  local_328 = 0xf777123;
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x103358);
  if (SVar1 < 0x81) {
    local_b8 = &main::_binlog_sid;
    local_bc = 0;
    local_c0 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_c8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_330 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_3e8 = 0;
      local_3e0 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3d8,"main",&local_3e9);
      local_42d = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3b8,"main",&local_3ea);
      local_42c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_398,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingPointers.cpp"
                 ,&local_3eb);
      local_42b = 1;
      local_378 = 0x29;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_370,"Raw pointer value: {} {}",&local_3ec);
      local_42a = 1;
      binlog::address::address(&local_428,local_320);
      binlog::detail::concatenated_tags<char_const(&)[25],binlog::address,void*&>
                (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,
                 (void **)in_stack_fffffffffffff7a0);
      pacVar4 = mserialize::cx_string<50UL>::data(&local_41f);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_350,*pacVar4,&local_429);
      local_42a = 0;
      local_42b = 0;
      local_42c = 0;
      local_42d = 0;
      local_330._M_i =
           binlog::Session::addEventSource
                     (in_stack_fffffffffffff790,
                      (EventSource *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
      binlog::EventSource::~EventSource(in_stack_fffffffffffff760);
      std::allocator<char>::~allocator((allocator<char> *)&local_429);
      std::allocator<char>::~allocator((allocator<char> *)&local_3ec);
      std::allocator<char>::~allocator((allocator<char> *)&local_3eb);
      std::allocator<char>::~allocator((allocator<char> *)&local_3ea);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
      local_48 = &main::_binlog_sid;
      local_50._M_i = local_330._M_i;
      local_54 = 5;
      local_58 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_60 = local_50._M_i;
      if ((local_54 != 3) && (local_54 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_50._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::address::address(&local_438,local_320);
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[25],binlog::address,void*&>
              ((SessionWriter *)in_stack_fffffffffffff780,in_stack_fffffffffffff778,
               (uint64_t)in_stack_fffffffffffff770,in_stack_fffffffffffff768,
               (address *)in_stack_fffffffffffff760,(void **)in_stack_fffffffffffff758);
  }
  local_440 = local_318;
  local_448 = local_318;
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x103a16);
  if (SVar1 < 0x81) {
    local_d0 = &main::_binlog_sid;
    local_d4 = 0;
    local_d8 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_e0 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_450 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_508 = 0;
      local_500 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4f8,"main",&local_509);
      local_54d = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4d8,"main",&local_50a);
      local_54c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingPointers.cpp"
                 ,&local_50b);
      local_54b = 1;
      local_498 = 0x32;
      this_00 = local_490;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(this_00,"Const pointer value: {} {}",&local_50c);
      local_54a = 1;
      this = local_470;
      binlog::address::address(&local_548,local_440);
      binlog::detail::concatenated_tags<char_const(&)[27],binlog::address,void_const*&>
                ((char (*) [27])this_00,(address *)this,(void **)in_stack_fffffffffffff7a0);
      pacVar4 = mserialize::cx_string<50UL>::data(&local_53f);
      paVar7 = &local_549;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(this,*pacVar4,paVar7);
      local_54a = 0;
      local_54b = 0;
      local_54c = 0;
      local_54d = 0;
      local_450._M_i =
           binlog::Session::addEventSource
                     (in_stack_fffffffffffff790,
                      (EventSource *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
      binlog::EventSource::~EventSource(in_stack_fffffffffffff760);
      std::allocator<char>::~allocator((allocator<char> *)&local_549);
      std::allocator<char>::~allocator((allocator<char> *)&local_50c);
      std::allocator<char>::~allocator((allocator<char> *)&local_50b);
      std::allocator<char>::~allocator((allocator<char> *)&local_50a);
      std::allocator<char>::~allocator((allocator<char> *)&local_509);
      local_68 = &main::_binlog_sid;
      local_70 = (Session *)local_450._M_i;
      local_74 = 5;
      in_stack_fffffffffffff780 = &main::_binlog_sid;
      local_78 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_80 = local_70;
      if (local_74 == 3) {
        ((SessionWriter *)in_stack_fffffffffffff780)->_session = local_70;
      }
      else if (local_74 == 5) {
        LOCK();
        ((SessionWriter *)in_stack_fffffffffffff780)->_session = local_70;
        UNLOCK();
      }
      else {
        ((SessionWriter *)in_stack_fffffffffffff780)->_session = local_70;
      }
    }
    pSVar2 = binlog::default_thread_local_writer();
    _Var6._M_i = local_450._M_i;
    clock = binlog::clockNow();
    binlog::address::address(&local_558,local_440);
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[27],binlog::address,void_const*&>
              ((SessionWriter *)in_stack_fffffffffffff780,(uint64_t)pSVar2,clock,
               (char (*) [27])_Var6._M_i,(address *)in_stack_fffffffffffff760,
               (void **)in_stack_fffffffffffff758);
  }
  binlog::consume<std::ostream>
            ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff760);
  local_e4 = 0;
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x104034);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)in_stack_fffffffffffff760);
  return local_e4;
}

Assistant:

int main()
{
  // Standard pointers

  //[stdptr
  int* ptr = nullptr;
  std::unique_ptr<int> uptr(std::make_unique<int>(1));
  std::shared_ptr<int> sptr(std::make_shared<int>(2));
  BINLOG_INFO("Pointers: {} {} {}", ptr, uptr, sptr);
  // Outputs: Pointers: {null} 1 2
  //]

  int value = 3;
  ptr = &value;
  uptr.reset();
  sptr.reset();
  BINLOG_INFO("Pointers: {} {} {}", ptr, uptr, sptr);
  // Outputs: Pointers: 3 {null} {null}

  // weak_ptr is not loggable by design, must be .lock()-ed first
  static_assert(
    !mserialize::detail::is_serializable<std::weak_ptr<int>>::value,
    "std::weak_ptr is not loggable"
  );

  // Addresses (raw pointer value)

  std::uintptr_t address = 0xf777123;

  int* any_pointer = nullptr;
  void* void_pointer = nullptr;
  std::memcpy(&any_pointer, &address, sizeof(any_pointer));
  std::memcpy(&void_pointer, &address, sizeof(void_pointer));

  //[address
  BINLOG_INFO("Raw pointer value: {} {}", binlog::address(any_pointer), void_pointer);
  // Outputs: Raw pointer value: 0xF777123 0xF777123
  //]

  const int* const_any_pointer = nullptr;
  const void* const_void_pointer = nullptr;
  std::memcpy(&const_any_pointer, &address, sizeof(const_any_pointer));
  std::memcpy(&const_void_pointer, &address, sizeof(const_void_pointer));

  BINLOG_INFO("Const pointer value: {} {}", binlog::address(const_any_pointer), const_void_pointer);
  // Outputs: Const pointer value: 0xF777123 0xF777123

  binlog::consume(std::cout);
  return 0;
}